

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O0

void Gia_ManReprToAigRepr2(Aig_Man_t *pAig,Gia_Man_t *pGia)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Aig_Obj_t *pNode1;
  Aig_Obj_t *pNode2;
  bool bVar3;
  int local_2c;
  int i;
  Gia_Obj_t *pGiaRepr;
  Gia_Obj_t *pGiaObj;
  Gia_Man_t *pGia_local;
  Aig_Man_t *pAig_local;
  
  if (pAig->pReprs != (Aig_Obj_t **)0x0) {
    __assert_fail("pAig->pReprs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAig.c"
                  ,0x1cf,"void Gia_ManReprToAigRepr2(Aig_Man_t *, Gia_Man_t *)");
  }
  if (pGia->pReprs == (Gia_Rpr_t *)0x0) {
    __assert_fail("pGia->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAig.c"
                  ,0x1d0,"void Gia_ManReprToAigRepr2(Aig_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Aig_ManObjNumMax(pAig);
  Aig_ManReprStart(pAig,iVar1);
  local_2c = 0;
  while( true ) {
    bVar3 = false;
    if (local_2c < pGia->nObjs) {
      pGiaRepr = Gia_ManObj(pGia,local_2c);
      bVar3 = pGiaRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pGVar2 = Gia_ObjReprObj(pGia,local_2c);
    if (pGVar2 != (Gia_Obj_t *)0x0) {
      iVar1 = Abc_Lit2Var(pGVar2->Value);
      pNode1 = Aig_ManObj(pAig,iVar1);
      iVar1 = Abc_Lit2Var(pGiaRepr->Value);
      pNode2 = Aig_ManObj(pAig,iVar1);
      Aig_ObjCreateRepr(pAig,pNode1,pNode2);
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void Gia_ManReprToAigRepr2( Aig_Man_t * pAig, Gia_Man_t * pGia )
{
    Gia_Obj_t * pGiaObj, * pGiaRepr;
    int i;
    assert( pAig->pReprs == NULL );
    assert( pGia->pReprs != NULL );
    // set the pointers to the nodes in AIG
    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    Gia_ManForEachObj( pGia, pGiaObj, i )
    {
        pGiaRepr = Gia_ObjReprObj( pGia, i );
        if ( pGiaRepr == NULL )
            continue;
        Aig_ObjCreateRepr( pAig, Aig_ManObj(pAig, Abc_Lit2Var(pGiaRepr->Value)), Aig_ManObj(pAig, Abc_Lit2Var(pGiaObj->Value)) );
    }
}